

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDCLoader.cpp
# Opt level: O0

void __thiscall Assimp::MDCImporter::ValidateSurfaceHeader(MDCImporter *this,Surface *pcSurf)

{
  DeadlyImportError *this_00;
  allocator<char> local_41;
  string local_40;
  uint local_1c;
  Surface *pSStack_18;
  uint iMax;
  Surface *pcSurf_local;
  MDCImporter *this_local;
  
  local_1c = this->fileSize - ((int)pcSurf - (int)this->pcHeader);
  if (((((ulong)pcSurf->ulOffsetBaseVerts + (ulong)pcSurf->ulNumVertices * 8 <= (ulong)local_1c) &&
       ((((pcSurf->ulNumCompFrames == 0 ||
          ((ulong)pcSurf->ulOffsetCompVerts + (ulong)pcSurf->ulNumVertices * 4 <= (ulong)local_1c))
         && ((ulong)pcSurf->ulOffsetTriangles + (ulong)pcSurf->ulNumTriangles * 0xc <=
             (ulong)local_1c)) &&
        (((ulong)pcSurf->ulOffsetTexCoords + (ulong)pcSurf->ulNumVertices * 8 <= (ulong)local_1c &&
         ((ulong)pcSurf->ulOffsetShaders + (ulong)pcSurf->ulNumShaders * 0x44 <= (ulong)local_1c))))
       )) && (pcSurf->ulOffsetFrameBaseFrames + pcSurf->ulNumBaseFrames * 2 <= local_1c)) &&
     ((pcSurf->ulNumCompFrames == 0 ||
      (pcSurf->ulOffsetFrameCompFrames + pcSurf->ulNumCompFrames * 2 <= local_1c)))) {
    return;
  }
  pSStack_18 = pcSurf;
  pcSurf_local = (Surface *)this;
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "Some of the offset values in the MDC surface header are invalid and point somewhere behind the file."
             ,&local_41);
  DeadlyImportError::DeadlyImportError(this_00,&local_40);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void MDCImporter::ValidateSurfaceHeader(BE_NCONST MDC::Surface* pcSurf)
{
    AI_SWAP4(pcSurf->ulFlags);
    AI_SWAP4(pcSurf->ulNumCompFrames);
    AI_SWAP4(pcSurf->ulNumBaseFrames);
    AI_SWAP4(pcSurf->ulNumShaders);
    AI_SWAP4(pcSurf->ulNumVertices);
    AI_SWAP4(pcSurf->ulNumTriangles);
    AI_SWAP4(pcSurf->ulOffsetTriangles);
    AI_SWAP4(pcSurf->ulOffsetTexCoords);
    AI_SWAP4(pcSurf->ulOffsetBaseVerts);
    AI_SWAP4(pcSurf->ulOffsetCompVerts);
    AI_SWAP4(pcSurf->ulOffsetFrameBaseFrames);
    AI_SWAP4(pcSurf->ulOffsetFrameCompFrames);
    AI_SWAP4(pcSurf->ulOffsetEnd);

    const unsigned int iMax = this->fileSize - (unsigned int)((int8_t*)pcSurf-(int8_t*)pcHeader);

    if (pcSurf->ulOffsetBaseVerts + pcSurf->ulNumVertices * sizeof(MDC::BaseVertex)         > iMax ||
        (pcSurf->ulNumCompFrames && pcSurf->ulOffsetCompVerts + pcSurf->ulNumVertices * sizeof(MDC::CompressedVertex)   > iMax) ||
        pcSurf->ulOffsetTriangles + pcSurf->ulNumTriangles * sizeof(MDC::Triangle)          > iMax ||
        pcSurf->ulOffsetTexCoords + pcSurf->ulNumVertices * sizeof(MDC::TexturCoord)        > iMax ||
        pcSurf->ulOffsetShaders + pcSurf->ulNumShaders * sizeof(MDC::Shader)                > iMax ||
        pcSurf->ulOffsetFrameBaseFrames + pcSurf->ulNumBaseFrames * 2                       > iMax ||
        (pcSurf->ulNumCompFrames && pcSurf->ulOffsetFrameCompFrames + pcSurf->ulNumCompFrames * 2   > iMax))
    {
        throw DeadlyImportError("Some of the offset values in the MDC surface header "
            "are invalid and point somewhere behind the file.");
    }
}